

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

void set_cached_x509_store(Curl_cfilter *cf,Curl_easy *data,X509_STORE *store)

{
  int iVar1;
  ssl_primary_config *psVar2;
  multi_ssl_backend_data *pmVar3;
  curltime cVar4;
  Curl_multi *local_58;
  undefined4 uStack_44;
  char *local_40;
  char *CAfile;
  multi_ssl_backend_data *mbackend;
  Curl_multi *multi;
  ssl_primary_config *conn_config;
  X509_STORE *store_local;
  Curl_easy *data_local;
  Curl_cfilter *cf_local;
  
  psVar2 = Curl_ssl_cf_get_primary_config(cf);
  if (data->multi_easy == (Curl_multi *)0x0) {
    local_58 = data->multi;
  }
  else {
    local_58 = data->multi_easy;
  }
  if (local_58 != (Curl_multi *)0x0) {
    if (local_58->ssl_backend_data == (multi_ssl_backend_data *)0x0) {
      pmVar3 = (multi_ssl_backend_data *)(*Curl_ccalloc)(1,0x20);
      local_58->ssl_backend_data = pmVar3;
      if (local_58->ssl_backend_data == (multi_ssl_backend_data *)0x0) {
        return;
      }
    }
    pmVar3 = local_58->ssl_backend_data;
    iVar1 = X509_STORE_up_ref(store);
    if (iVar1 != 0) {
      local_40 = (char *)0x0;
      if ((psVar2->CAfile == (char *)0x0) ||
         (local_40 = (*Curl_cstrdup)(psVar2->CAfile), local_40 != (char *)0x0)) {
        if (pmVar3->store != (X509_STORE *)0x0) {
          X509_STORE_free((X509_STORE *)pmVar3->store);
          (*Curl_cfree)(pmVar3->CAfile);
        }
        cVar4 = Curl_now();
        (pmVar3->time).tv_sec = cVar4.tv_sec;
        *(ulong *)&(pmVar3->time).tv_usec = CONCAT44(uStack_44,cVar4.tv_usec);
        pmVar3->store = store;
        pmVar3->CAfile = local_40;
      }
      else {
        X509_STORE_free((X509_STORE *)store);
      }
    }
  }
  return;
}

Assistant:

static void set_cached_x509_store(struct Curl_cfilter *cf,
                                  const struct Curl_easy *data,
                                  X509_STORE *store)
{
  struct ssl_primary_config *conn_config = Curl_ssl_cf_get_primary_config(cf);
  struct Curl_multi *multi = data->multi_easy ? data->multi_easy : data->multi;
  struct multi_ssl_backend_data *mbackend;

  DEBUGASSERT(multi);
  if(!multi)
    return;

  if(!multi->ssl_backend_data) {
    multi->ssl_backend_data = calloc(1, sizeof(struct multi_ssl_backend_data));
    if(!multi->ssl_backend_data)
      return;
  }

  mbackend = multi->ssl_backend_data;

  if(X509_STORE_up_ref(store)) {
    char *CAfile = NULL;

    if(conn_config->CAfile) {
      CAfile = strdup(conn_config->CAfile);
      if(!CAfile) {
        X509_STORE_free(store);
        return;
      }
    }

    if(mbackend->store) {
      X509_STORE_free(mbackend->store);
      free(mbackend->CAfile);
    }

    mbackend->time = Curl_now();
    mbackend->store = store;
    mbackend->CAfile = CAfile;
  }
}